

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dupi_vec_s390x(TCGContext_conflict12 *tcg_ctx,uint vece,TCGv_vec r,uint64_t a)

{
  uint64_t uVar1;
  
  uVar1 = dup_const_func_s390x(vece,a);
  do_dupi_vec(tcg_ctx,r,(uint)uVar1,a);
  return;
}

Assistant:

void tcg_gen_dupi_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, uint64_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(vece, a));
}